

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O0

void __thiscall
rsg::BinaryOp<8,_(rsg::Associativity)0>::tokenize
          (BinaryOp<8,_(rsg::Associativity)0> *this,GeneratorState *state,TokenStream *str)

{
  TokenStream *this_00;
  Token local_30;
  TokenStream *local_20;
  TokenStream *str_local;
  GeneratorState *state_local;
  BinaryOp<8,_(rsg::Associativity)0> *this_local;
  
  local_20 = str;
  str_local = (TokenStream *)state;
  state_local = (GeneratorState *)this;
  (*this->m_leftValueExpr->_vptr_Expression[3])(this->m_leftValueExpr,state,str);
  this_00 = local_20;
  Token::Token(&local_30,this->m_operator);
  TokenStream::operator<<(this_00,&local_30);
  Token::~Token(&local_30);
  (*this->m_rightValueExpr->_vptr_Expression[3])(this->m_rightValueExpr,str_local,local_20);
  return;
}

Assistant:

void BinaryOp<Precedence, Assoc>::tokenize (GeneratorState& state, TokenStream& str) const
{
	m_leftValueExpr->tokenize(state, str);
	str << m_operator;
	m_rightValueExpr->tokenize(state, str);
}